

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coolprop_tracer.h
# Opt level: O1

pair<double,_double> __thiscall
PyVLEIsolineTracer<double>::get_integration_limits(PyVLEIsolineTracer<double> *this)

{
  pair<double,_double> pVar1;
  function overload;
  object o;
  gil_scoped_release release;
  make_caster<std::pair<double,_double>_> conv;
  gil_scoped_acquire gil;
  gil_scoped_acquire acquire;
  handle local_78;
  handle local_70;
  double local_68;
  double local_60;
  gil_scoped_release local_58;
  type_caster<std::pair<double,_double>,_void> local_48;
  gil_scoped_acquire local_30;
  gil_scoped_acquire local_20;
  
  local_58.disassoc = false;
  pybind11::detail::get_internals();
  local_58.tstate = (PyThreadState *)PyEval_SaveThread();
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_20);
  pybind11::gil_scoped_acquire::gil_scoped_acquire(&local_30);
  pybind11::get_overload<VLEIsolineTracer<double>>
            ((pybind11 *)&local_78,&this->super_VLEIsolineTracer<double>,"get_integration_limits");
  if (local_78.m_ptr != (PyObject *)0x0) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_70);
    local_48.super_tuple_caster<std::pair,_double,_double>.subcasters.first.value = 0.0;
    local_48.super_tuple_caster<std::pair,_double,_double>.subcasters.second.value = 0.0;
    pybind11::detail::load_type<std::pair<double,double>,void>(&local_48,&local_70);
    local_60 = local_48.super_tuple_caster<std::pair,_double,_double>.subcasters.first.value;
    local_68 = local_48.super_tuple_caster<std::pair,_double,_double>.subcasters.second.value;
    pybind11::object::~object((object *)&local_70);
  }
  pybind11::object::~object((object *)&local_78);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_30);
  if (local_78.m_ptr == (PyObject *)0x0) {
    pVar1 = AbstractIsolineTracer<double>::get_integration_limits
                      ((AbstractIsolineTracer<double> *)this);
    local_68 = pVar1.second;
    local_60 = pVar1.first;
  }
  pybind11::gil_scoped_acquire::~gil_scoped_acquire(&local_20);
  pybind11::gil_scoped_release::~gil_scoped_release(&local_58);
  pVar1.second = local_68;
  pVar1.first = local_60;
  return pVar1;
}

Assistant:

std::pair<TYPE, TYPE> get_integration_limits() override {
        // Release the GIL
        py::gil_scoped_release release;
        {
            // Acquire GIL before calling Python code
            py::gil_scoped_acquire acquire;

            // Parameters to macro are: Return type, parent class, name of function in C++, argument(s)
            typedef std::pair<TYPE, TYPE> pairdoubledouble;
            PYBIND11_OVERLOAD(pairdoubledouble, 
                              VLEIsolineTracer, 
                              get_integration_limits, 
                              // No arguments
                              );
        }
    }